

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O2

bool __thiscall pugi::xml_node::remove_attribute(xml_node *this,xml_attribute *a)

{
  xml_node_struct *node;
  xml_attribute_struct *a_00;
  xml_attribute_struct *pxVar1;
  xml_attribute_struct *pxVar2;
  xml_attribute_struct *pxVar3;
  xml_attribute_struct **ppxVar4;
  xml_allocator *alloc;
  
  node = this->_root;
  a_00 = a->_attr;
  pxVar1 = a_00;
  if (a_00 != (xml_attribute_struct *)0x0 && node != (xml_node_struct *)0x0) {
    do {
      pxVar3 = pxVar1;
      pxVar1 = pxVar3->prev_attribute_c;
    } while (pxVar1->next_attribute != (xml_attribute_struct *)0x0);
    if (pxVar3 == node->first_attribute) {
      pxVar1 = a_00->next_attribute;
      pxVar3 = node->first_attribute;
      if (pxVar1 != (xml_attribute_struct *)0x0) {
        pxVar3 = pxVar1;
      }
      pxVar2 = a_00->prev_attribute_c;
      pxVar3->prev_attribute_c = pxVar2;
      ppxVar4 = &pxVar2->next_attribute;
      if (pxVar2->next_attribute == (xml_attribute_struct *)0x0) {
        ppxVar4 = &node->first_attribute;
      }
      *ppxVar4 = pxVar1;
      alloc = impl::anon_unknown_0::get_allocator(node);
      impl::anon_unknown_0::destroy_attribute(a_00,alloc);
      return true;
    }
  }
  return false;
}

Assistant:

PUGI__FN bool xml_node::remove_attribute(const xml_attribute& a)
	{
		if (!_root || !a._attr) return false;

		// check that attribute belongs to *this
		xml_attribute_struct* attr = a._attr;

		while (attr->prev_attribute_c->next_attribute) attr = attr->prev_attribute_c;

		if (attr != _root->first_attribute) return false;

		if (a._attr->next_attribute) a._attr->next_attribute->prev_attribute_c = a._attr->prev_attribute_c;
		else if (_root->first_attribute) _root->first_attribute->prev_attribute_c = a._attr->prev_attribute_c;
		
		if (a._attr->prev_attribute_c->next_attribute) a._attr->prev_attribute_c->next_attribute = a._attr->next_attribute;
		else _root->first_attribute = a._attr->next_attribute;

		impl::destroy_attribute(a._attr, impl::get_allocator(_root));

		return true;
	}